

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsystemsemaphore_posix.cpp
# Opt level: O1

bool __thiscall
QSystemSemaphorePosix::modifySemaphore
          (QSystemSemaphorePosix *this,QSystemSemaphorePrivate *self,int count)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int *piVar5;
  int iVar6;
  long in_FS_OFFSET;
  QLatin1StringView function;
  QLatin1StringView function_00;
  QString local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = false;
  bVar1 = handle(this,self,Open);
  if (!bVar1) goto LAB_004ab4b1;
  iVar6 = count;
  if (0 < count) {
    do {
      iVar3 = sem_post((sem_t *)this->semaphore);
      if (iVar3 == -1) {
        function.m_data = "QSystemSemaphore::modifySemaphore (sem_post)";
        function.m_size = 0x2c;
        QSystemSemaphorePrivate::setUnixErrorString(self,function);
        if (iVar6 < count) goto LAB_004ab41f;
        break;
      }
      bVar2 = 1 < iVar6;
      iVar6 = iVar6 + -1;
    } while (bVar2);
    goto LAB_004ab43e;
  }
  do {
    iVar6 = sem_wait((sem_t *)this->semaphore);
    bVar2 = false;
    if (iVar6 != -1) goto LAB_004ab460;
    piVar5 = __errno_location();
    iVar3 = *piVar5;
  } while (iVar3 == 4);
  if ((iVar3 == 0x2b) || (iVar3 == 0x16)) {
    this->semaphore = (sem_t *)0x0;
    bVar2 = modifySemaphore(this,self,count);
  }
  else {
    function_00.m_data = "QSystemSemaphore::modifySemaphore (sem_wait)";
    function_00.m_size = 0x2c;
    QSystemSemaphorePrivate::setUnixErrorString(self,function_00);
    bVar2 = false;
  }
LAB_004ab460:
  if (iVar6 == -1) goto LAB_004ab4b1;
  goto LAB_004ab466;
LAB_004ab41f:
  do {
    iVar4 = sem_wait((sem_t *)this->semaphore);
    if (iVar4 == -1) {
      piVar5 = __errno_location();
      if (*piVar5 == 4) goto LAB_004ab41f;
    }
    iVar6 = iVar6 + 1;
  } while (iVar6 != count);
LAB_004ab43e:
  if (iVar3 == -1) {
    bVar2 = false;
    goto LAB_004ab4b1;
  }
LAB_004ab466:
  local_48.d.d = (Data *)0x0;
  local_48.d.ptr = (char16_t *)0x0;
  local_48.d.size = 0;
  self->error = NoError;
  QString::operator=(&self->errorString,&local_48);
  if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
    }
  }
  bVar2 = true;
LAB_004ab4b1:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return bVar2;
}

Assistant:

bool QSystemSemaphorePosix::modifySemaphore(QSystemSemaphorePrivate *self, int count)
{
    if (!handle(self, QSystemSemaphore::Open))
        return false;

    if (count > 0) {
        int cnt = count;
        do {
            if (::sem_post(semaphore) == -1) {
#if defined(Q_OS_VXWORKS)
                if (errno == EINVAL) {
                    semaphore = SEM_FAILED;
                    return modifySemaphore(self, cnt);
                }
#endif
                self->setUnixErrorString("QSystemSemaphore::modifySemaphore (sem_post)"_L1);
#if defined QSYSTEMSEMAPHORE_DEBUG
                qDebug("QSystemSemaphorePosix::modify sem_post failed %d %d", count, errno);
#endif
                // rollback changes to preserve the SysV semaphore behavior
                for ( ; cnt < count; ++cnt) {
                    int res;
                    QT_EINTR_LOOP(res, ::sem_wait(semaphore));
                }
                return false;
            }
            --cnt;
        } while (cnt > 0);
    } else {
        int res;
        QT_EINTR_LOOP(res, ::sem_wait(semaphore));
        if (res == -1) {
            // If the semaphore was removed be nice and create it and then modifySemaphore again
            if (errno == EINVAL || errno == EIDRM) {
                semaphore = SEM_FAILED;
                return modifySemaphore(self, count);
            }
            self->setUnixErrorString("QSystemSemaphore::modifySemaphore (sem_wait)"_L1);
#if defined QSYSTEMSEMAPHORE_DEBUG
            qDebug("QSystemSemaphorePosix::modify sem_wait failed %d %d", count, errno);
#endif
            return false;
        }
    }

    self->clearError();
    return true;
}